

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  short *__s;
  char *__s_00;
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  int i;
  int iVar4;
  Controller controller;
  string map_file_path;
  Renderer renderer;
  Game game;
  Controller local_2849;
  long *local_2848;
  char *local_2840;
  long local_2838 [2];
  string local_2828;
  Renderer local_2808;
  Game local_27d8;
  
  local_2848 = local_2838;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2848);
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"To specify a map file use the following format: ",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: [executable] [-m path_to_map.map]",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__cxx11::string::_M_replace((ulong)&local_2848,0,local_2840,0x105061);
  }
  else {
    iVar4 = 1;
    do {
      __s = (short *)argv[iVar4];
      sVar2 = strlen((char *)__s);
      pcVar1 = local_2840;
      if (((sVar2 == 2) && (*__s == 0x6d2d)) && (iVar4 = iVar4 + 1, iVar4 < argc)) {
        __s_00 = argv[iVar4];
        strlen(__s_00);
        std::__cxx11::string::_M_replace((ulong)&local_2848,0,pcVar1,(ulong)__s_00);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < argc);
  }
  Renderer::Renderer(&local_2808,0x280,0x280,0x20,0x20);
  local_2828._M_dataplus._M_p = (pointer)&local_2828.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2828,local_2848,local_2840 + (long)local_2848);
  Game::Game(&local_27d8,0x20,0x20,&local_2828);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2828._M_dataplus._M_p != &local_2828.field_2) {
    operator_delete(local_2828._M_dataplus._M_p,local_2828.field_2._M_allocated_capacity + 1);
  }
  Game::Run(&local_27d8,&local_2849,&local_2808,0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Game has terminated successfully!\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Score: ",7);
  iVar4 = Game::GetScore(&local_27d8);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size: ",6);
  iVar4 = Game::GetSize(&local_27d8);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::random_device::_M_fini();
  if (local_27d8.map._map.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_27d8.map._map.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_27d8.map._map.
                          super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_27d8.map._map.
                          super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27d8.map._filepath._M_dataplus._M_p != &local_27d8.map._filepath.field_2) {
    operator_delete(local_27d8.map._filepath._M_dataplus._M_p,
                    local_27d8.map._filepath.field_2._M_allocated_capacity + 1);
  }
  if (local_27d8.snake.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_27d8.snake.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_27d8.snake.body.
                          super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_27d8.snake.body.
                          super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Renderer::~Renderer(&local_2808);
  if (local_2848 != local_2838) {
    operator_delete(local_2848,local_2838[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, const char **argv) {
    constexpr std::size_t kFramesPerSecond{60};
    constexpr std::size_t kMsPerFrame{1000 / kFramesPerSecond};
    constexpr std::size_t kScreenWidth{640};
    constexpr std::size_t kScreenHeight{640};
    constexpr std::size_t kGridWidth{32};
    constexpr std::size_t kGridHeight{32};

  // For taking user input for custom maps
    std::string map_file_path = "";
    if (argc > 1) {
        for (int i = 1; i < argc; ++i)
            if (std::string_view{argv[i]} == "-m" && ++i < argc)
                map_file_path = argv[i];

    } else {
        std::cout << "To specify a map file use the following format: " << std::endl;
        std::cout << "Usage: [executable] [-m path_to_map.map]" << std::endl;
        map_file_path = "../maps/map2.map";
    }

    Renderer renderer(kScreenWidth, kScreenHeight, kGridWidth, kGridHeight);
    Controller controller;
    Game game(kGridWidth, kGridHeight, map_file_path);
    game.Run(controller, renderer, kMsPerFrame);
    std::cout << "Game has terminated successfully!\n";
    std::cout << "Score: " << game.GetScore() << "\n";
    std::cout << "Size: " << game.GetSize() << "\n";
    return 0;
}